

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_accumulation.cc
# Opt level: O2

bool __thiscall
sptk::ProductAccumulation::Run
          (ProductAccumulation *this,vector<double,_std::allocator<double>_> *data,Buffer *buffer)

{
  double dVar1;
  double *pdVar2;
  pointer pdVar3;
  bool bVar4;
  pointer pdVar5;
  double *pdVar6;
  size_type __new_size;
  double *pdVar7;
  double dVar8;
  
  if (this->is_valid_ == true) {
    bVar4 = false;
    if ((buffer != (Buffer *)0x0) &&
       (__new_size = (long)this->num_order_ + 1, bVar4 = false,
       (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == __new_size)) {
      if ((long)(buffer->interim_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->interim_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(&buffer->interim_,__new_size);
        pdVar3 = (buffer->interim_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pdVar5 = (buffer->interim_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start; pdVar5 != pdVar3; pdVar5 = pdVar5 + 1) {
          *pdVar5 = 1.0;
        }
      }
      buffer->num_data_ = buffer->num_data_ + 1;
      pdVar7 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar6 = (buffer->interim_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (this->numerically_stable_ == true) {
        for (; pdVar7 != pdVar2; pdVar7 = pdVar7 + 1) {
          dVar1 = *pdVar6;
          dVar8 = log(*pdVar7);
          *pdVar6 = dVar8 + dVar1;
          pdVar6 = pdVar6 + 1;
        }
      }
      else {
        std::
        transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::multiplies<double>>
                  (pdVar7,pdVar2,pdVar6,pdVar6);
      }
      bVar4 = true;
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool ProductAccumulation::Run(const std::vector<double>& data,
                              ProductAccumulation::Buffer* buffer) const {
  // Check inputs.
  const std::size_t length(num_order_ + 1);
  if (!is_valid_ || data.size() != length || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->interim_.size() != length) {
    buffer->interim_.resize(length);
    std::fill(buffer->interim_.begin(), buffer->interim_.end(), 1.0);
  }

  ++(buffer->num_data_);

  if (numerically_stable_) {
    std::transform(data.begin(), data.end(), buffer->interim_.begin(),
                   buffer->interim_.begin(),
                   [](double x, double y) { return std::log(x) + y; });
  } else {
    std::transform(data.begin(), data.end(), buffer->interim_.begin(),
                   buffer->interim_.begin(), std::multiplies<double>());
  }

  return true;
}